

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::DataTypeApplyOp(ImGuiDataType data_type,int op,void *output,void *arg1,void *arg2)

{
  char cVar1;
  short sVar2;
  uint uVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  short sVar9;
  char cVar10;
  short sVar11;
  long lVar12;
  
  if ((op != 0x2b) && (op != 0x2d)) {
    __assert_fail("op == \'+\' || op == \'-\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0x6ab,
                  "void ImGui::DataTypeApplyOp(ImGuiDataType, int, void *, void *, const void *)");
  }
  switch(data_type) {
  case 0:
    if (op == 0x2b) {
      cVar5 = *arg1;
      cVar1 = *arg2;
      cVar10 = -0x80;
      if (-1 < cVar1 || -0x80 - cVar1 <= (int)cVar5) {
        cVar10 = '\x7f';
        if ((int)cVar5 <= 0x7f - cVar1) {
          cVar10 = cVar5 + cVar1;
        }
        if (cVar1 < '\x01') {
          cVar10 = cVar5 + cVar1;
        }
      }
      *(char *)output = cVar10;
    }
    if (op == 0x2d) {
      cVar5 = *arg1;
      cVar1 = *arg2;
      cVar10 = -0x80;
      if (cVar1 < '\x01' || (int)((int)cVar1 | 0xffffff80U) <= (int)cVar5) {
        cVar10 = '\x7f';
        if ((int)cVar5 <= (int)((int)cVar1 + 0x7fU)) {
          cVar10 = cVar5 - cVar1;
        }
        if (-1 < cVar1) {
          cVar10 = cVar5 - cVar1;
        }
      }
      *(char *)output = cVar10;
    }
    break;
  case 1:
    if (op == 0x2b) {
      cVar5 = -1;
      if (!CARRY1(*arg2,*arg1)) {
        cVar5 = *arg2 + *arg1;
      }
      *(char *)output = cVar5;
    }
    if (op == 0x2d) {
      cVar5 = *arg1 - *arg2;
      if (*arg1 < *arg2) {
        cVar5 = '\0';
      }
      *(char *)output = cVar5;
    }
    break;
  case 2:
    if (op == 0x2b) {
      sVar9 = *arg1;
      sVar2 = *arg2;
      sVar11 = -0x8000;
      if (-1 < sVar2 || -0x8000 - sVar2 <= (int)sVar9) {
        sVar11 = 0x7fff;
        if ((int)sVar9 <= 0x7fff - sVar2) {
          sVar11 = sVar2 + sVar9;
        }
        if (sVar2 < 1) {
          sVar11 = sVar2 + sVar9;
        }
      }
      *(short *)output = sVar11;
    }
    if (op == 0x2d) {
      sVar9 = *arg1;
      sVar2 = *arg2;
      sVar11 = -0x8000;
      if (sVar2 < 1 || (int)((int)sVar2 | 0xffff8000U) <= (int)sVar9) {
        sVar11 = 0x7fff;
        if ((int)sVar9 <= (int)((int)sVar2 + 0x7fffU)) {
          sVar11 = sVar9 - sVar2;
        }
        if (-1 < sVar2) {
          sVar11 = sVar9 - sVar2;
        }
      }
      *(short *)output = sVar11;
    }
    break;
  case 3:
    if (op == 0x2b) {
      sVar9 = -1;
      if (!CARRY2(*arg2,*arg1)) {
        sVar9 = *arg2 + *arg1;
      }
      *(short *)output = sVar9;
    }
    if (op == 0x2d) {
      sVar9 = *arg1 - *arg2;
      if (*arg1 < *arg2) {
        sVar9 = 0;
      }
      *(short *)output = sVar9;
    }
    break;
  case 4:
    if (op == 0x2b) {
      iVar7 = *arg1;
      uVar3 = *arg2;
      iVar6 = -0x80000000;
      if (-1 < (int)uVar3 || (int)(-0x80000000 - uVar3) <= iVar7) {
        iVar6 = 0x7fffffff;
        if (iVar7 <= (int)(uVar3 ^ 0x7fffffff)) {
          iVar6 = uVar3 + iVar7;
        }
        if ((int)uVar3 < 1) {
          iVar6 = uVar3 + iVar7;
        }
      }
      *(int *)output = iVar6;
    }
    if (op == 0x2d) {
      iVar7 = *arg1;
      uVar3 = *arg2;
      iVar6 = -0x80000000;
      if ((int)uVar3 < 1 || (int)(uVar3 | 0x80000000) <= iVar7) {
        iVar6 = 0x7fffffff;
        if (iVar7 <= (int)(uVar3 + 0x7fffffff)) {
          iVar6 = iVar7 - uVar3;
        }
        if (-1 < (int)uVar3) {
          iVar6 = iVar7 - uVar3;
        }
      }
      *(int *)output = iVar6;
    }
    break;
  case 5:
    if (op == 0x2b) {
      iVar7 = -1;
      if (!CARRY4(*arg2,*arg1)) {
        iVar7 = *arg2 + *arg1;
      }
      *(int *)output = iVar7;
    }
    if (op == 0x2d) {
      iVar7 = *arg1 - *arg2;
      if (*arg1 < *arg2) {
        iVar7 = 0;
      }
      *(int *)output = iVar7;
    }
    break;
  case 6:
    if (op == 0x2b) {
      lVar8 = *arg1;
      lVar4 = *arg2;
      if ((-1 < lVar4) || (lVar12 = -0x8000000000000000, -0x8000000000000000 - lVar4 <= lVar8)) {
        lVar12 = lVar4 + lVar8;
        if (0x7fffffffffffffff - lVar4 < lVar8) {
          lVar12 = 0x7fffffffffffffff;
        }
        if (lVar4 < 1) {
          lVar12 = lVar4 + lVar8;
        }
      }
      *(long *)output = lVar12;
    }
    if (op == 0x2d) {
      lVar8 = *arg1;
      lVar4 = *arg2;
      if ((lVar4 < 1) || (lVar4 + -0x8000000000000000 <= lVar8)) {
        lVar12 = 0x7fffffffffffffff;
        if (lVar8 <= lVar4 + 0x7fffffffffffffff) {
          lVar12 = lVar8 - lVar4;
        }
        if (-1 < lVar4) {
          lVar12 = lVar8 - lVar4;
        }
      }
      else {
        lVar12 = -0x8000000000000000;
      }
      *(long *)output = lVar12;
    }
    break;
  case 7:
    if (op == 0x2b) {
      lVar8 = -1;
      if (!CARRY8(*arg2,*arg1)) {
        lVar8 = *arg2 + *arg1;
      }
      *(long *)output = lVar8;
    }
    if (op == 0x2d) {
      lVar8 = 0;
      if (*arg2 <= *arg1) {
        lVar8 = *arg1 - *arg2;
      }
      *(long *)output = lVar8;
    }
    break;
  case 8:
    if (op == 0x2b) {
      *(float *)output = *arg1 + *arg2;
    }
    if (op == 0x2d) {
      *(float *)output = *arg1 - *arg2;
    }
    break;
  case 9:
    if (op == 0x2b) {
      *(double *)output = *arg1 + *arg2;
    }
    if (op == 0x2d) {
      *(double *)output = *arg1 - *arg2;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0x6d8,
                  "void ImGui::DataTypeApplyOp(ImGuiDataType, int, void *, void *, const void *)");
  }
  return;
}

Assistant:

void ImGui::DataTypeApplyOp(ImGuiDataType data_type, int op, void* output, void* arg1, const void* arg2)
{
    IM_ASSERT(op == '+' || op == '-');
    switch (data_type)
    {
        case ImGuiDataType_S8:
            if (op == '+') { *(ImS8*)output  = ImAddClampOverflow(*(const ImS8*)arg1,  *(const ImS8*)arg2,  IM_S8_MIN,  IM_S8_MAX); }
            if (op == '-') { *(ImS8*)output  = ImSubClampOverflow(*(const ImS8*)arg1,  *(const ImS8*)arg2,  IM_S8_MIN,  IM_S8_MAX); }
            return;
        case ImGuiDataType_U8:
            if (op == '+') { *(ImU8*)output  = ImAddClampOverflow(*(const ImU8*)arg1,  *(const ImU8*)arg2,  IM_U8_MIN,  IM_U8_MAX); }
            if (op == '-') { *(ImU8*)output  = ImSubClampOverflow(*(const ImU8*)arg1,  *(const ImU8*)arg2,  IM_U8_MIN,  IM_U8_MAX); }
            return;
        case ImGuiDataType_S16:
            if (op == '+') { *(ImS16*)output = ImAddClampOverflow(*(const ImS16*)arg1, *(const ImS16*)arg2, IM_S16_MIN, IM_S16_MAX); }
            if (op == '-') { *(ImS16*)output = ImSubClampOverflow(*(const ImS16*)arg1, *(const ImS16*)arg2, IM_S16_MIN, IM_S16_MAX); }
            return;
        case ImGuiDataType_U16:
            if (op == '+') { *(ImU16*)output = ImAddClampOverflow(*(const ImU16*)arg1, *(const ImU16*)arg2, IM_U16_MIN, IM_U16_MAX); }
            if (op == '-') { *(ImU16*)output = ImSubClampOverflow(*(const ImU16*)arg1, *(const ImU16*)arg2, IM_U16_MIN, IM_U16_MAX); }
            return;
        case ImGuiDataType_S32:
            if (op == '+') { *(ImS32*)output = ImAddClampOverflow(*(const ImS32*)arg1, *(const ImS32*)arg2, IM_S32_MIN, IM_S32_MAX); }
            if (op == '-') { *(ImS32*)output = ImSubClampOverflow(*(const ImS32*)arg1, *(const ImS32*)arg2, IM_S32_MIN, IM_S32_MAX); }
            return;
        case ImGuiDataType_U32:
            if (op == '+') { *(ImU32*)output = ImAddClampOverflow(*(const ImU32*)arg1, *(const ImU32*)arg2, IM_U32_MIN, IM_U32_MAX); }
            if (op == '-') { *(ImU32*)output = ImSubClampOverflow(*(const ImU32*)arg1, *(const ImU32*)arg2, IM_U32_MIN, IM_U32_MAX); }
            return;
        case ImGuiDataType_S64:
            if (op == '+') { *(ImS64*)output = ImAddClampOverflow(*(const ImS64*)arg1, *(const ImS64*)arg2, IM_S64_MIN, IM_S64_MAX); }
            if (op == '-') { *(ImS64*)output = ImSubClampOverflow(*(const ImS64*)arg1, *(const ImS64*)arg2, IM_S64_MIN, IM_S64_MAX); }
            return;
        case ImGuiDataType_U64:
            if (op == '+') { *(ImU64*)output = ImAddClampOverflow(*(const ImU64*)arg1, *(const ImU64*)arg2, IM_U64_MIN, IM_U64_MAX); }
            if (op == '-') { *(ImU64*)output = ImSubClampOverflow(*(const ImU64*)arg1, *(const ImU64*)arg2, IM_U64_MIN, IM_U64_MAX); }
            return;
        case ImGuiDataType_Float:
            if (op == '+') { *(float*)output = *(const float*)arg1 + *(const float*)arg2; }
            if (op == '-') { *(float*)output = *(const float*)arg1 - *(const float*)arg2; }
            return;
        case ImGuiDataType_Double:
            if (op == '+') { *(double*)output = *(const double*)arg1 + *(const double*)arg2; }
            if (op == '-') { *(double*)output = *(const double*)arg1 - *(const double*)arg2; }
            return;
        case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
}